

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::~DeviceContextBase
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer pcVar3;
  IObject *pIVar4;
  ITextureView *pIVar5;
  long lVar6;
  
  (this->super_ObjectBase<Diligent::IDeviceContextVk>).
  super_RefCountedObject<Diligent::IDeviceContextVk>.super_IDeviceContextVk.super_IDeviceContext.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00af0690;
  std::
  _Hashtable<Diligent::IBuffer_*,_std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IBuffer_*>,_std::hash<Diligent::IBuffer_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_DbgMappedBuffers)._M_h);
  puVar2 = (this->m_ScratchSpace).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_ScratchSpace).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pcVar3 = (this->m_Name)._M_dataplus._M_p;
  paVar1 = &(this->m_Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pIVar4 = (this->m_pUserData).m_pObject;
  if (pIVar4 != (IObject *)0x0) {
    (*pIVar4->_vptr_IObject[2])();
    (this->m_pUserData).m_pObject = (IObject *)0x0;
  }
  pIVar5 = (this->m_pBoundShadingRateMap).m_pObject;
  if (pIVar5 != (ITextureView *)0x0) {
    (*(pIVar5->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    (this->m_pBoundShadingRateMap).m_pObject = (ITextureView *)0x0;
  }
  RefCntAutoPtr<Diligent::RenderPassVkImpl>::Release(&this->m_pActiveRenderPass);
  RefCntAutoPtr<Diligent::FramebufferVkImpl>::Release(&this->m_pBoundFramebuffer);
  RefCntAutoPtr<Diligent::TextureViewVkImpl>::Release(&this->m_pBoundDepthStencil);
  lVar6 = 0;
  do {
    RefCntAutoPtr<Diligent::TextureViewVkImpl>::Release
              ((RefCntAutoPtr<Diligent::TextureViewVkImpl> *)
               ((long)&this->m_pBoundRenderTargets[7].m_pObject + lVar6));
    lVar6 = lVar6 + -8;
  } while (lVar6 != -0x40);
  RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&this->m_pIndexBuffer);
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::Release(&this->m_pPipelineState);
  lVar6 = 0x208;
  do {
    RefCntAutoPtr<Diligent::BufferVkImpl>::Release
              ((RefCntAutoPtr<Diligent::BufferVkImpl> *)
               ((long)this->m_VertexStreams + lVar6 + -0x18));
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 8);
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::Release(&this->m_pDevice);
  return;
}

Assistant:

~DeviceContextBase()
    {
    }